

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O3

QString * __thiscall QFont::toString(QString *__return_storage_ptr__,QFont *this)

{
  QString *pQVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  QArrayData *pQVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  longlong __old_val_11;
  QFontPrivate *pQVar8;
  longlong __old_val_5;
  long in_FS_OFFSET;
  QTypedArrayData<char16_t> *__old_val_2;
  longlong __old_val;
  longlong __old_val_1;
  Data *local_2150;
  qsizetype local_2148;
  char16_t *local_2140;
  QArrayData *local_2108;
  char16_t *pcStack_2100;
  qsizetype local_20f8;
  QString local_20f0;
  QArrayData *local_20d8;
  char16_t *pcStack_20d0;
  qsizetype local_20c8;
  QString local_20c0;
  QArrayData *local_20a8;
  char16_t *pcStack_20a0;
  qsizetype local_2098;
  QString local_2090;
  QArrayData *local_2078;
  char16_t *pcStack_2070;
  qsizetype local_2068;
  QString local_2060;
  QArrayData *local_2048;
  char16_t *pcStack_2040;
  qsizetype local_2038;
  QString local_2030;
  QArrayData *local_2018;
  char16_t *pcStack_2010;
  qsizetype local_2008;
  QString local_2000;
  QArrayData *local_1fe8;
  char16_t *pcStack_1fe0;
  qsizetype local_1fd8;
  QArrayData *local_1fc8;
  char16_t *pcStack_1fc0;
  qsizetype local_1fb8;
  QArrayData *local_1fa8;
  char16_t *pcStack_1fa0;
  qsizetype local_1f98;
  QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString> local_1f88;
  QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString> local_1f50;
  Data *local_1f18;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_1f10;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_1eb8;
  Data *local_1e60;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_1e58;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  local_1de0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_1d60;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_1cc8;
  Data *local_1c30;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_1c28;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  local_1b70;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_1ab0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_19d8;
  Data *local_1900;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_18f8;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  local_1800;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_1700;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_15e8;
  Data *local_14d0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_14c8;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  local_1390;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_1250;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_10f8;
  Data *local_fa0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_f98;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  local_e20;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_ca0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_b08;
  Data *local_970;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_968;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>
  local_7b0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_5f0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_418;
  Data *local_240;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  local_238;
  undefined2 local_3a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3a = 0x2c;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar8 = (this->d).d.ptr;
  if ((pQVar8->request).families.d.size == 0) {
    local_2150 = (Data *)0x0;
    local_2140 = (char16_t *)0x0;
    local_2148 = 0;
  }
  else {
    pQVar1 = (pQVar8->request).families.d.ptr;
    local_2150 = (pQVar1->d).d;
    local_2140 = (pQVar1->d).ptr;
    local_2148 = (pQVar1->d).size;
    if (local_2150 == (Data *)0x0) {
      local_2150 = (Data *)0x0;
    }
    else {
      LOCK();
      (local_2150->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (local_2150->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      pQVar8 = (this->d).d.ptr;
    }
  }
  QString::number((pQVar8->request).pointSize,(char)&local_1fa8,0x67);
  qVar7 = local_1f98;
  pcVar6 = pcStack_1fa0;
  pQVar5 = local_1fa8;
  local_1f98 = 0;
  local_1f88.a.a.d.d = (Data *)0x0;
  local_1f88.a.a.d.ptr = (char16_t *)0x0;
  local_1f88.a.a.d.size = 0;
  local_1f88.b.d.d = (Data *)0x0;
  local_1f88.b.d.ptr = (char16_t *)0x0;
  local_1f88.b.d.size = 0;
  local_1fa8 = (QArrayData *)0x0;
  pcStack_1fa0 = (char16_t *)0x0;
  local_1f88.a.b = (QChar *)&local_3a;
  local_1f50.a.b = (QChar *)&local_3a;
  local_1f18 = (Data *)&local_3a;
  QString::number((int)&local_1fc8,(int)(((this->d).d.ptr)->request).pixelSize);
  qVar4 = local_1fb8;
  pcVar3 = pcStack_1fc0;
  pQVar2 = local_1fc8;
  local_1f50.a.a.d.d = (Data *)0x0;
  local_1f50.a.a.d.ptr = (char16_t *)0x0;
  local_1f50.a.a.d.size = 0;
  local_1f50.b.d.d = (Data *)0x0;
  local_1f50.b.d.ptr = (char16_t *)0x0;
  local_1f50.b.d.size = 0;
  local_1fb8 = 0;
  local_1f10.a.a.a.a.d.d = (Data *)0x0;
  local_1f10.a.a.a.a.d.ptr = (char16_t *)0x0;
  local_1f10.a.a.a.a.d.size = 0;
  local_1f10.a.a.b.d.d = (Data *)0x0;
  local_1f10.a.a.b.d.ptr = (char16_t *)0x0;
  local_1f10.a.a.b.d.size = 0;
  local_1f10.b.d.d = (Data *)0x0;
  local_1f10.b.d.ptr = (char16_t *)0x0;
  local_1f10.b.d.size = 0;
  local_1fc8 = (QArrayData *)0x0;
  pcStack_1fc0 = (char16_t *)0x0;
  local_1f10.a.a.a.b = (QChar *)&local_3a;
  local_1f10.a.b = (QChar *)&local_3a;
  local_1eb8.a.a.a.b = (QChar *)&local_3a;
  local_1eb8.a.b = (QChar *)&local_3a;
  local_1e60 = (Data *)&local_3a;
  QString::number((int)&local_1fe8,(uint)(byte)(((this->d).d.ptr)->request).field_0x64);
  local_1de0.a.b.d.size = local_1fd8;
  local_1de0.a.b.d.ptr = pcStack_1fe0;
  local_1de0.a.b.d.d = (Data *)local_1fe8;
  local_1eb8.a.a.a.a.d.d = (Data *)0x0;
  local_1eb8.a.a.a.a.d.ptr = (char16_t *)0x0;
  local_1eb8.a.a.a.a.d.size = 0;
  local_1eb8.a.a.b.d.d = (Data *)0x0;
  local_1eb8.a.a.b.d.ptr = (char16_t *)0x0;
  local_1eb8.a.a.b.d.size = 0;
  local_1eb8.b.d.d = (Data *)0x0;
  local_1eb8.b.d.ptr = (char16_t *)0x0;
  local_1eb8.b.d.size = 0;
  local_1fd8 = 0;
  local_1e58.a.a.a.a.a.a.d.d = (Data *)0x0;
  local_1de0.a.a.a.a.a.a.a.d.d = local_2150;
  local_1e58.a.a.a.a.a.a.d.ptr = (char16_t *)0x0;
  local_1e58.a.a.a.a.a.a.d.size = 0;
  local_1de0.a.a.a.a.a.a.a.d.ptr = local_2140;
  local_1de0.a.a.a.a.a.a.a.d.size = local_2148;
  local_1e58.a.a.a.a.b.d.d = (Data *)0x0;
  local_1e58.a.a.a.a.b.d.ptr = (char16_t *)0x0;
  local_1de0.a.a.a.a.a.b.d.d = (Data *)pQVar5;
  local_1de0.a.a.a.a.a.b.d.ptr = pcVar6;
  local_1e58.a.a.a.a.b.d.size = 0;
  local_1de0.a.a.a.a.a.b.d.size = qVar7;
  local_1e58.a.a.b.d.d = (Data *)0x0;
  local_1e58.a.a.b.d.ptr = (char16_t *)0x0;
  local_1de0.a.a.a.b.d.d = (Data *)pQVar2;
  local_1de0.a.a.a.b.d.ptr = pcVar3;
  local_1e58.a.a.b.d.size = 0;
  local_1de0.a.a.a.b.d.size = qVar4;
  local_1e58.b.d.d = (Data *)0x0;
  local_1e58.b.d.ptr = (char16_t *)0x0;
  local_1fe8 = (QArrayData *)0x0;
  pcStack_1fe0 = (char16_t *)0x0;
  local_1e58.b.d.size = 0;
  local_1e58.a.a.a.a.a.b = (QChar *)&local_3a;
  local_1e58.a.a.a.b = (QChar *)&local_3a;
  local_1e58.a.b = (QChar *)&local_3a;
  local_1de0.a.a.a.a.a.a.b = (QChar *)&local_3a;
  local_1de0.a.a.a.a.b = (QChar *)&local_3a;
  local_1de0.a.a.b = (QChar *)&local_3a;
  local_1de0.b = (QChar *)&local_3a;
  QString::number((int)&local_2000,
                  (uint)((ulong)*(undefined8 *)&(((this->d).d.ptr)->request).field_0x60 >> 0x28) &
                  0x3ff);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_1d60,&local_1de0,&local_2000);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_1cc8,&local_1d60);
  local_1c30 = (Data *)&local_3a;
  QString::number((int)&local_2018,*(uint *)&(((this->d).d.ptr)->request).field_0x60 >> 0x1c & 3);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_1c28,&local_1cc8);
  local_1c28.b.d.size = local_2008;
  local_1c28.b.d.ptr = pcStack_2010;
  local_1c28.b.d.d = (Data *)local_2018;
  local_1c28.a.b = (QChar *)local_1c30;
  local_2018 = (QArrayData *)0x0;
  pcStack_2010 = (char16_t *)0x0;
  local_2008 = 0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_1b70,
                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_1c28);
  local_1b70.a.b.d.ptr = local_1c28.b.d.ptr;
  local_1b70.a.b.d.d = local_1c28.b.d.d;
  local_1c28.b.d.d = (Data *)0x0;
  local_1c28.b.d.ptr = (char16_t *)0x0;
  local_1b70.a.a.b = local_1c28.a.b;
  local_1b70.a.b.d.size = local_1c28.b.d.size;
  local_1c28.b.d.size = 0;
  local_1b70.b = (QChar *)&local_3a;
  QString::number((int)&local_2030,(byte)((this->d).d.ptr)->field_0x7c & 1);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_1ab0,&local_1b70,&local_2030);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_19d8,&local_1ab0);
  local_1900 = (Data *)&local_3a;
  QString::number((int)&local_2048,*(uint *)&((this->d).d.ptr)->field_0x7c >> 2 & 1);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_18f8,&local_19d8);
  local_18f8.b.d.size = local_2038;
  local_18f8.b.d.ptr = pcStack_2040;
  local_18f8.b.d.d = (Data *)local_2048;
  local_18f8.a.b = (QChar *)local_1900;
  local_2048 = (QArrayData *)0x0;
  pcStack_2040 = (char16_t *)0x0;
  local_2038 = 0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_1800,
                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_18f8);
  local_1800.a.b.d.ptr = local_18f8.b.d.ptr;
  local_1800.a.b.d.d = local_18f8.b.d.d;
  local_18f8.b.d.d = (Data *)0x0;
  local_18f8.b.d.ptr = (char16_t *)0x0;
  local_1800.a.a.b = local_18f8.a.b;
  local_1800.a.b.d.size = local_18f8.b.d.size;
  local_18f8.b.d.size = 0;
  local_1800.b = (QChar *)&local_3a;
  QString::number((int)&local_2060,
                  (uint)((ulong)*(undefined8 *)&(((this->d).d.ptr)->request).field_0x60 >> 0x32) & 1
                 );
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_1700,&local_1800,&local_2060);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_15e8,&local_1700);
  local_14d0 = (Data *)&local_3a;
  QString::number((int)&local_2078,0);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_14c8,&local_15e8);
  local_14c8.b.d.size = local_2068;
  local_14c8.b.d.ptr = pcStack_2070;
  local_14c8.b.d.d = (Data *)local_2078;
  local_14c8.a.b = (QChar *)local_14d0;
  local_2078 = (QArrayData *)0x0;
  pcStack_2070 = (char16_t *)0x0;
  local_2068 = 0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_1390,
                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_14c8);
  local_1390.a.b.d.ptr = local_14c8.b.d.ptr;
  local_1390.a.b.d.d = local_14c8.b.d.d;
  local_14c8.b.d.d = (Data *)0x0;
  local_14c8.b.d.ptr = (char16_t *)0x0;
  local_1390.a.a.b = local_14c8.a.b;
  local_1390.a.b.d.size = local_14c8.b.d.size;
  local_14c8.b.d.size = 0;
  local_1390.b = (QChar *)&local_3a;
  QString::number((int)&local_2090,*(uint *)&((this->d).d.ptr)->field_0x7c >> 4 & 7);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_1250,&local_1390,&local_2090);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_10f8,&local_1250);
  local_fa0 = (Data *)&local_3a;
  QString::number((int)&local_20a8,(uint)((byte)((this->d).d.ptr)->field_0x7c >> 7));
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_f98,&local_10f8);
  local_f98.b.d.size = local_2098;
  local_f98.b.d.ptr = pcStack_20a0;
  local_f98.b.d.d = (Data *)local_20a8;
  local_f98.a.b = (QChar *)local_fa0;
  local_20a8 = (QArrayData *)0x0;
  pcStack_20a0 = (char16_t *)0x0;
  local_2098 = 0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_e20,
                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_f98);
  local_e20.a.b.d.ptr = local_f98.b.d.ptr;
  local_e20.a.b.d.d = local_f98.b.d.d;
  local_f98.b.d.d = (Data *)0x0;
  local_f98.b.d.ptr = (char16_t *)0x0;
  local_e20.a.a.b = local_f98.a.b;
  local_e20.a.b.d.size = local_f98.b.d.size;
  local_f98.b.d.size = 0;
  local_e20.b = (QChar *)&local_3a;
  QString::number((double)(((this->d).d.ptr)->letterSpacing).val * 0.015625,(char)&local_20c0,0x67);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_ca0,&local_e20,&local_20c0);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_b08,&local_ca0);
  local_970 = (Data *)&local_3a;
  QString::number((double)(((this->d).d.ptr)->wordSpacing).val * 0.015625,(char)&local_20d8,0x67);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_968,&local_b08);
  local_968.b.d.size = local_20c8;
  local_968.b.d.ptr = pcStack_20d0;
  local_968.b.d.d = (Data *)local_20d8;
  local_968.a.b = (QChar *)local_970;
  local_20d8 = (QArrayData *)0x0;
  pcStack_20d0 = (char16_t *)0x0;
  local_20c8 = 0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_7b0,
                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_968);
  local_7b0.a.b.d.ptr = local_968.b.d.ptr;
  local_7b0.a.b.d.d = local_968.b.d.d;
  local_968.b.d.d = (Data *)0x0;
  local_968.b.d.ptr = (char16_t *)0x0;
  local_7b0.a.a.b = local_968.a.b;
  local_7b0.a.b.d.size = local_968.b.d.size;
  local_968.b.d.size = 0;
  local_7b0.b = (QChar *)&local_3a;
  QString::number((int)&local_20f0,*(ushort *)&(((this->d).d.ptr)->request).field_0x62 & 0xfff);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_5f0,&local_7b0,&local_20f0);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder(&local_418,&local_5f0);
  local_240 = (Data *)&local_3a;
  QString::number((int)&local_2108,(uint)*(ushort *)&(((this->d).d.ptr)->request).field_0x60);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
                    *)&local_238,&local_418);
  local_238.b.d.size = local_20f8;
  local_238.b.d.ptr = pcStack_2100;
  local_238.b.d.d = (Data *)local_2108;
  local_238.a.b = (QChar *)local_240;
  local_2108 = (QArrayData *)0x0;
  pcStack_2100 = (char16_t *)0x0;
  local_20f8 = 0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::convertTo<QString>(__return_storage_ptr__,&local_238);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_238);
  if (local_2108 != (QArrayData *)0x0) {
    LOCK();
    (local_2108->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_2108->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_2108->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_2108,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_418);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_5f0);
  if (&(local_20f0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_20f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_20f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_20f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_20f0.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_7b0.a);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_968);
  if (local_20d8 != (QArrayData *)0x0) {
    LOCK();
    (local_20d8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_20d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_20d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_20d8,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_b08);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_ca0);
  if (&(local_20c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_20c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_20c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_20c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_20c0.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_e20.a);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_f98);
  if (local_20a8 != (QArrayData *)0x0) {
    LOCK();
    (local_20a8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_20a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_20a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_20a8,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_10f8);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1250);
  if (&(local_2090.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2090.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2090.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_2090.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_2090.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1390.a);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_14c8);
  if (local_2078 != (QArrayData *)0x0) {
    LOCK();
    (local_2078->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_2078->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_2078->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_2078,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_15e8);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1700);
  if (&(local_2060.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2060.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2060.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_2060.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_2060.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1800.a);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_18f8);
  if (local_2048 != (QArrayData *)0x0) {
    LOCK();
    (local_2048->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_2048->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_2048->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_2048,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_19d8);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1ab0);
  if (&(local_2030.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2030.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2030.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_2030.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_2030.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1b70.a);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1c28);
  if (local_2018 != (QArrayData *)0x0) {
    LOCK();
    (local_2018->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_2018->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_2018->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_2018,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1cc8);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1d60);
  if (&(local_2000.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2000.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2000.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_2000.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_2000.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1de0.a);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1e58);
  if (local_1fe8 != (QArrayData *)0x0) {
    LOCK();
    (local_1fe8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1fe8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1fe8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_1fe8,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1eb8);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>,_const_QChar_&>,_QString>
  ::~QStringBuilder(&local_1f10);
  if (local_1fc8 != (QArrayData *)0x0) {
    LOCK();
    (local_1fc8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1fc8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1fc8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_1fc8,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>::~QStringBuilder(&local_1f50);
  QStringBuilder<QStringBuilder<QString,_const_QChar_&>,_QString>::~QStringBuilder(&local_1f88);
  if (local_1fa8 != (QArrayData *)0x0) {
    LOCK();
    (local_1fa8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1fa8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1fa8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_1fa8,2,0x10);
    }
  }
  pQVar8 = (this->d).d.ptr;
  local_238.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.d =
       (pQVar8->request).styleName.d.d;
  local_238.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.ptr =
       (pQVar8->request).styleName.d.ptr;
  local_238.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.size =
       (pQVar8->request).styleName.d.size;
  if (&(local_238.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.d)->super_QArrayData
      != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)
     &((local_238.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.d)->super_QArrayData
      ).ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)
          &((local_238.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.d)->
           super_QArrayData).ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_238.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.size != 0) {
    local_418.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.d = (Data *)&local_3a;
    local_418.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.ptr = (char16_t *)&local_238
    ;
    ::operator+=(__return_storage_ptr__,(QStringBuilder<const_QChar_&,_QString_&> *)&local_418);
  }
  if (&(local_238.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.d)->super_QArrayData
      != (QArrayData *)0x0) {
    LOCK();
    ((local_238.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.d)->super_QArrayData).
    ref_._q_value.super___atomic_base<int>._M_i =
         ((local_238.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.d)->
         super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_238.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.d)->
        super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate
                (&(local_238.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.a.d.d)->
                  super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QFont::toString() const
{
    const QChar comma(u',');
    QString fontDescription = family() + comma +
        QString::number(     pointSizeF()) + comma +
        QString::number(      pixelSize()) + comma +
        QString::number((int) styleHint()) + comma +
        QString::number(         weight()) + comma +
        QString::number((int)     style()) + comma +
        QString::number((int) underline()) + comma +
        QString::number((int) strikeOut()) + comma +
        QString::number((int)fixedPitch()) + comma +
        QString::number((int)   false) + comma +
        QString::number((int)capitalization()) + comma +
        QString::number((int)letterSpacingType()) + comma +
        QString::number(letterSpacing()) + comma +
        QString::number(wordSpacing()) + comma +
        QString::number(stretch()) + comma +
        QString::number((int)styleStrategy());

    QString fontStyle = styleName();
    if (!fontStyle.isEmpty())
        fontDescription += comma + fontStyle;

    return fontDescription;
}